

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O0

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *scalar)

{
  int iVar1;
  uint uVar2;
  secp256k1_gej tmpj;
  secp256k1_fe neg_y_3;
  int idx_n_3;
  int abs_n_3;
  int mask_3;
  int m_3;
  secp256k1_fe neg_y_2;
  int idx_n_2;
  int abs_n_2;
  int mask_2;
  int m_2;
  int j;
  int n;
  secp256k1_fe neg_y_1;
  int idx_n_1;
  int abs_n_1;
  int mask_1;
  int m_1;
  secp256k1_fe neg_y;
  int idx_n;
  int abs_n;
  int mask;
  int m;
  int i;
  int wnaf_1 [33];
  secp256k1_scalar q_lam;
  secp256k1_scalar q_1;
  int skew_lam;
  int wnaf_lam [33];
  secp256k1_ge pre_a_lam [8];
  int skew_1;
  secp256k1_fe Z;
  secp256k1_ge tmpa;
  secp256k1_ge pre_a [8];
  secp256k1_gej *in_stack_fffffffffffff708;
  secp256k1_gej *in_stack_fffffffffffff710;
  secp256k1_scalar *in_stack_fffffffffffff740;
  secp256k1_scalar *in_stack_fffffffffffff748;
  int in_stack_fffffffffffff750;
  int in_stack_fffffffffffff754;
  secp256k1_scalar *in_stack_fffffffffffff758;
  int *in_stack_fffffffffffff760;
  secp256k1_gej *in_stack_fffffffffffff778;
  secp256k1_gej *in_stack_fffffffffffff780;
  secp256k1_fe local_878;
  int local_850;
  uint local_84c;
  uint local_848;
  int local_844;
  secp256k1_fe local_840;
  int local_818;
  uint local_814;
  uint local_810;
  int local_80c;
  int local_808;
  uint local_804;
  secp256k1_fe local_800;
  int local_7d8;
  uint local_7d4;
  uint local_7d0;
  int local_7cc;
  secp256k1_gej *in_stack_fffffffffffff840;
  secp256k1_fe *in_stack_fffffffffffff848;
  secp256k1_ge *in_stack_fffffffffffff850;
  int local_790;
  int local_78c;
  uint local_788 [32];
  uint local_708;
  secp256k1_ge *in_stack_fffffffffffff910;
  secp256k1_gej *in_stack_fffffffffffff918;
  secp256k1_gej *in_stack_fffffffffffff920;
  uint local_6b8 [32];
  uint local_638;
  secp256k1_fe local_628;
  secp256k1_fe asStack_600 [16];
  int local_35c;
  secp256k1_fe local_330;
  secp256k1_fe sStack_308;
  undefined4 local_2e0;
  secp256k1_fe local_2d8;
  secp256k1_fe asStack_2b0 [17];
  
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x105cac);
  if (iVar1 == 0) {
    secp256k1_scalar_split_lambda
              ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
               in_stack_fffffffffffff748,in_stack_fffffffffffff740);
    local_35c = secp256k1_wnaf_const
                          (in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                           in_stack_fffffffffffff754,in_stack_fffffffffffff750);
    secp256k1_wnaf_const
              (in_stack_fffffffffffff760,in_stack_fffffffffffff758,in_stack_fffffffffffff754,
               in_stack_fffffffffffff750);
    secp256k1_gej_set_ge(in_stack_fffffffffffff710,(secp256k1_ge *)in_stack_fffffffffffff708);
    secp256k1_ecmult_odd_multiples_table_globalz_windowa
              (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
    for (local_78c = 0; local_78c < 8; local_78c = local_78c + 1) {
      secp256k1_fe_impl_normalize_weak((secp256k1_fe *)((long)asStack_2b0 + (long)local_78c * 0x58))
      ;
    }
    for (local_78c = 0; local_78c < 8; local_78c = local_78c + 1) {
      secp256k1_ge_mul_lambda
                ((secp256k1_ge *)in_stack_fffffffffffff710,(secp256k1_ge *)in_stack_fffffffffffff708
                );
    }
    uVar2 = local_708 + ((int)local_708 >> 0x1f) ^ (int)local_708 >> 0x1f;
    iVar1 = (int)uVar2 >> 1;
    memcpy(&local_330,&local_2d8,0x28);
    memcpy(&sStack_308,asStack_2b0,0x28);
    for (local_790 = 1; local_790 < 8; local_790 = local_790 + 1) {
      secp256k1_fe_impl_cmov
                (&local_330,(secp256k1_fe *)((long)&local_2d8 + (long)local_790 * 0x58),
                 (uint)(local_790 == iVar1));
      secp256k1_fe_impl_cmov
                (&sStack_308,(secp256k1_fe *)((long)asStack_2b0 + (long)local_790 * 0x58),
                 (uint)(local_790 == iVar1));
    }
    local_2e0 = 0;
    secp256k1_fe_impl_negate_unchecked((secp256k1_fe *)&stack0xfffffffffffff838,&sStack_308,1);
    secp256k1_fe_impl_cmov
              (&sStack_308,(secp256k1_fe *)&stack0xfffffffffffff838,(uint)(local_708 != uVar2));
    secp256k1_gej_set_ge(in_stack_fffffffffffff710,(secp256k1_ge *)in_stack_fffffffffffff708);
    local_7cc = 0;
    local_7d0 = (int)local_638 >> 0x1f;
    local_7d4 = local_638 + local_7d0 ^ local_7d0;
    local_7d8 = (int)local_7d4 >> 1;
    memcpy(&local_330,&local_628,0x28);
    memcpy(&sStack_308,(void *)((long)asStack_600 + (long)local_7cc * 0x58),0x28);
    for (local_7cc = 1; local_7cc < 8; local_7cc = local_7cc + 1) {
      secp256k1_fe_impl_cmov
                (&local_330,(secp256k1_fe *)((long)&local_628 + (long)local_7cc * 0x58),
                 (uint)(local_7cc == local_7d8));
      secp256k1_fe_impl_cmov
                (&sStack_308,(secp256k1_fe *)((long)asStack_600 + (long)local_7cc * 0x58),
                 (uint)(local_7cc == local_7d8));
    }
    local_2e0 = 0;
    secp256k1_fe_impl_negate_unchecked(&local_800,&sStack_308,1);
    secp256k1_fe_impl_cmov(&sStack_308,&local_800,(uint)(local_638 != local_7d4));
    secp256k1_gej_add_ge
              (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910);
    for (local_78c = 0x1f; -1 < local_78c; local_78c = local_78c + -1) {
      for (local_808 = 0; local_808 < 4; local_808 = local_808 + 1) {
        secp256k1_gej_double(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
      }
      local_804 = local_788[local_78c];
      local_80c = 0;
      local_810 = (int)local_804 >> 0x1f;
      local_814 = local_804 + local_810 ^ local_810;
      local_818 = (int)local_814 >> 1;
      memcpy(&local_330,&local_2d8,0x28);
      memcpy(&sStack_308,(void *)((long)asStack_2b0 + (long)local_80c * 0x58),0x28);
      for (local_80c = 1; local_80c < 8; local_80c = local_80c + 1) {
        secp256k1_fe_impl_cmov
                  (&local_330,(secp256k1_fe *)((long)&local_2d8 + (long)local_80c * 0x58),
                   (uint)(local_80c == local_818));
        secp256k1_fe_impl_cmov
                  (&sStack_308,(secp256k1_fe *)((long)asStack_2b0 + (long)local_80c * 0x58),
                   (uint)(local_80c == local_818));
      }
      local_2e0 = 0;
      secp256k1_fe_impl_negate_unchecked(&local_840,&sStack_308,1);
      secp256k1_fe_impl_cmov(&sStack_308,&local_840,(uint)(local_804 != local_814));
      secp256k1_gej_add_ge
                (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910);
      local_804 = local_6b8[local_78c];
      local_844 = 0;
      local_848 = (int)local_804 >> 0x1f;
      local_84c = local_804 + local_848 ^ local_848;
      local_850 = (int)local_84c >> 1;
      memcpy(&local_330,&local_628,0x28);
      memcpy(&sStack_308,(void *)((long)asStack_600 + (long)local_844 * 0x58),0x28);
      for (local_844 = 1; local_844 < 8; local_844 = local_844 + 1) {
        secp256k1_fe_impl_cmov
                  (&local_330,(secp256k1_fe *)((long)&local_628 + (long)local_844 * 0x58),
                   (uint)(local_844 == local_850));
        secp256k1_fe_impl_cmov
                  (&sStack_308,(secp256k1_fe *)((long)asStack_600 + (long)local_844 * 0x58),
                   (uint)(local_844 == local_850));
      }
      local_2e0 = 0;
      secp256k1_fe_impl_negate_unchecked(&local_878,&sStack_308,1);
      secp256k1_fe_impl_cmov(&sStack_308,&local_878,(uint)(local_804 != local_84c));
      secp256k1_gej_add_ge
                (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910);
    }
    secp256k1_ge_neg((secp256k1_ge *)in_stack_fffffffffffff710,
                     (secp256k1_ge *)in_stack_fffffffffffff708);
    secp256k1_gej_add_ge
              (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910);
    secp256k1_gej_cmov(in_stack_fffffffffffff710,in_stack_fffffffffffff708,0);
    secp256k1_ge_neg((secp256k1_ge *)in_stack_fffffffffffff710,
                     (secp256k1_ge *)in_stack_fffffffffffff708);
    secp256k1_gej_add_ge
              (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910);
    secp256k1_gej_cmov(in_stack_fffffffffffff710,in_stack_fffffffffffff708,0);
    secp256k1_fe_impl_mul
              (&in_stack_fffffffffffff710->x,&in_stack_fffffffffffff708->x,(secp256k1_fe *)0x1066a2)
    ;
  }
  else {
    secp256k1_gej_set_infinity((secp256k1_gej *)0x105cbe);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *scalar) {
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge tmpa;
    secp256k1_fe Z;

    int skew_1;
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
    int wnaf_lam[1 + WNAF_SIZE(WINDOW_A - 1)];
    int skew_lam;
    secp256k1_scalar q_1, q_lam;
    int wnaf_1[1 + WNAF_SIZE(WINDOW_A - 1)];

    int i;

    if (secp256k1_ge_is_infinity(a)) {
        secp256k1_gej_set_infinity(r);
        return;
    }

    /* build wnaf representation for q. */
    /* split q into q_1 and q_lam (where q = q_1 + q_lam*lambda, and q_1 and q_lam are ~128 bit) */
    secp256k1_scalar_split_lambda(&q_1, &q_lam, scalar);
    skew_1   = secp256k1_wnaf_const(wnaf_1,   &q_1,   WINDOW_A - 1, 128);
    skew_lam = secp256k1_wnaf_const(wnaf_lam, &q_lam, WINDOW_A - 1, 128);

    /* Calculate odd multiples of a.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in Z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    VERIFY_CHECK(!a->infinity);
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_odd_multiples_table_globalz_windowa(pre_a, &Z, r);
    for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
        secp256k1_fe_normalize_weak(&pre_a[i].y);
    }
    for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
        secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
    }

    /* first loop iteration (separated out so we can directly set r, rather
     * than having it start at infinity, get doubled several times, then have
     * its new value added to it) */
    i = wnaf_1[WNAF_SIZE_BITS(128, WINDOW_A - 1)];
    VERIFY_CHECK(i != 0);
    ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, i, WINDOW_A);
    secp256k1_gej_set_ge(r, &tmpa);
    i = wnaf_lam[WNAF_SIZE_BITS(128, WINDOW_A - 1)];
    VERIFY_CHECK(i != 0);
    ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, i, WINDOW_A);
    secp256k1_gej_add_ge(r, r, &tmpa);
    /* remaining loop iterations */
    for (i = WNAF_SIZE_BITS(128, WINDOW_A - 1) - 1; i >= 0; i--) {
        int n;
        int j;
        for (j = 0; j < WINDOW_A - 1; ++j) {
            secp256k1_gej_double(r, r);
        }

        n = wnaf_1[i];
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, n, WINDOW_A);
        VERIFY_CHECK(n != 0);
        secp256k1_gej_add_ge(r, r, &tmpa);
        n = wnaf_lam[i];
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, n, WINDOW_A);
        VERIFY_CHECK(n != 0);
        secp256k1_gej_add_ge(r, r, &tmpa);
    }

    {
        /* Correct for wNAF skew */
        secp256k1_gej tmpj;

        secp256k1_ge_neg(&tmpa, &pre_a[0]);
        secp256k1_gej_add_ge(&tmpj, r, &tmpa);
        secp256k1_gej_cmov(r, &tmpj, skew_1);

        secp256k1_ge_neg(&tmpa, &pre_a_lam[0]);
        secp256k1_gej_add_ge(&tmpj, r, &tmpa);
        secp256k1_gej_cmov(r, &tmpj, skew_lam);
    }

    secp256k1_fe_mul(&r->z, &r->z, &Z);
}